

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O0

void cos1D_testSaveLoadAndParamHandling<IMLE>(IMLE *imleObj)

{
  IMLE *pIVar1;
  ostream *poVar2;
  IMLE *in_RDI;
  Param param;
  string *in_stack_00000240;
  IMLE *in_stack_00000248;
  int in_stack_0000092c;
  IMLE *in_stack_00000930;
  IMLE *in_stack_fffffffffffffe78;
  IMLE *in_stack_fffffffffffffe80;
  Param *in_stack_fffffffffffffe98;
  allocator *paVar3;
  Param *in_stack_fffffffffffffea0;
  Param *prm;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  undefined1 local_e1 [217];
  IMLE *local_8;
  
  local_8 = in_RDI;
  IMLE::getParameters(in_RDI);
  IMLE::Param::Param(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  pIVar1 = (IMLE *)std::operator<<((ostream *)&std::cout,"\t-- Initial parameters: --");
  std::ostream::operator<<(pIVar1,std::endl<char,std::char_traits<char>>);
  IMLE::displayParameters(in_stack_fffffffffffffe80,(ostream *)in_stack_fffffffffffffe78);
  prm = (Param *)local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_e1 + 1),"cos1D.xml",(allocator *)prm);
  IMLE::loadParameters(in_stack_00000248,in_stack_00000240);
  std::__cxx11::string::~string((string *)(local_e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e1);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "\t-- Now the IMLE object has default parameters: --");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  IMLE::displayParameters(in_stack_fffffffffffffe80,(ostream *)in_stack_fffffffffffffe78);
  IMLE::setParameters(pIVar1,prm);
  poVar2 = std::operator<<((ostream *)&std::cout,"\t-- Reverting to initial parameters: --");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  IMLE::displayParameters(in_stack_fffffffffffffe80,(ostream *)in_stack_fffffffffffffe78);
  cos1D_train<IMLE>(in_stack_00000930,in_stack_0000092c);
  cos1D_display<IMLE>(in_stack_fffffffffffffe80);
  paVar3 = &local_109;
  pIVar1 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"cos1D_demo.imle",paVar3);
  IMLE::save((IMLE *)param._128_8_,(string *)param._120_8_);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  IMLE::reset(in_stack_fffffffffffffe80);
  operator<<((ostream *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  cos1D_train<IMLE>(in_stack_00000930,in_stack_0000092c);
  cos1D_display<IMLE>(in_stack_fffffffffffffe80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"cos1D_demo.imle",&local_131);
  IMLE::load((IMLE *)param._128_8_,(string *)param._120_8_);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  operator<<((ostream *)local_8,in_stack_fffffffffffffe78);
  IMLE::Param::~Param((Param *)pIVar1);
  return;
}

Assistant:

void cos1D_testSaveLoadAndParamHandling( Learner &imleObj )
{
	// Parameter handling
	typename Learner::Param param = imleObj.getParameters();
	cout << "\t-- Initial parameters: --" << endl;
	imleObj.displayParameters();

	imleObj.loadParameters("cos1D.xml");
	cout << "\t-- Now the IMLE object has default parameters: --" << endl;
	imleObj.displayParameters();

	imleObj.setParameters(param);
	cout << "\t-- Reverting to initial parameters: --" << endl;
	imleObj.displayParameters();

	// Training (10 points)
    cos1D_train(imleObj, 10);

    // Display info
    cos1D_display(imleObj);

    // Save
    imleObj.save("cos1D_demo.imle");

    // Reset
    imleObj.reset();
    cout << imleObj;

    // Train again
    cos1D_train(imleObj, 20);
    cos1D_display(imleObj);

    // Load
    imleObj.load("cos1D_demo.imle");
    cout << imleObj;
}